

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O3

QString * __thiscall
Win32MakefileGenerator::escapeFilePath
          (QString *__return_storage_ptr__,Win32MakefileGenerator *this,QString *path)

{
  Data *pDVar1;
  qsizetype qVar2;
  QString *pQVar3;
  char16_t *pcVar4;
  QArrayData *pQVar5;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<const_char_(&)[2],_QString_&>,_const_char_(&)[2]> local_60;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (path->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (path->d).ptr;
  pQVar5 = (QArrayData *)(path->d).size;
  (__return_storage_ptr__->d).size = (qsizetype)pQVar5;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar5 = (QArrayData *)(__return_storage_ptr__->d).size;
  }
  if (pQVar5 == (QArrayData *)0x0) goto LAB_002626d6;
  pcVar4 = (__return_storage_ptr__->d).ptr;
  local_48.d.d = (Data *)pQVar5;
  local_48.d.ptr = pcVar4;
  qVar2 = QStringView::indexOf((QStringView *)&local_48,(QChar)0x20,0,CaseSensitive);
  if (qVar2 == -1) {
    local_48.d.d = (Data *)pQVar5;
    local_48.d.ptr = pcVar4;
    qVar2 = QStringView::indexOf((QStringView *)&local_48,(QChar)0x9,0,CaseSensitive);
    if (qVar2 != -1) goto LAB_002625c8;
  }
  else {
LAB_002625c8:
    local_60.a.a = (char (*) [2])0x2b5765;
    local_60.b = (char (*) [2])0x2b5765;
    local_60.a.b = __return_storage_ptr__;
    QStringBuilder<QStringBuilder<const_char_(&)[2],_QString_&>,_const_char_(&)[2]>::
    convertTo<QString>(&local_48,&local_60);
    pQVar5 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar4 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_48.d.d;
    (__return_storage_ptr__->d).ptr = local_48.d.ptr;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.d.size;
    local_48.d.d = (Data *)pQVar5;
    local_48.d.ptr = pcVar4;
    local_48.d.size = qVar2;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  if (Option::debug_level != 0) {
    QString::toLatin1_helper((QString *)&local_48);
    pcVar4 = local_48.d.ptr;
    if (local_48.d.ptr == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QByteArray::_empty;
    }
    QString::toLatin1_helper((QString *)&local_60);
    pQVar3 = local_60.a.b;
    if (local_60.a.b == (QString *)0x0) {
      pQVar3 = (QString *)&QByteArray::_empty;
    }
    debug_msg_internal(2,"EscapeFilePath: %s -> %s",pcVar4,pQVar3);
    if ((QArrayData *)local_60.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)*local_60.a.a)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)*local_60.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)*local_60.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_60.a.a,1,0x10);
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
LAB_002626d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString Win32MakefileGenerator::escapeFilePath(const QString &path) const
{
    QString ret = path;
    if(!ret.isEmpty()) {
        if (ret.contains(' ') || ret.contains('\t'))
            ret = "\"" + ret + "\"";
        debug_msg(2, "EscapeFilePath: %s -> %s", path.toLatin1().constData(), ret.toLatin1().constData());
    }
    return ret;
}